

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void up_free(Curl_easy *data)

{
  urlpieces *puVar1;
  urlpieces *up;
  Curl_easy *data_local;
  
  puVar1 = &(data->state).up;
  (*Curl_cfree)(puVar1->scheme);
  puVar1->scheme = (char *)0x0;
  (*Curl_cfree)((data->state).up.hostname);
  (data->state).up.hostname = (char *)0x0;
  (*Curl_cfree)((data->state).up.port);
  (data->state).up.port = (char *)0x0;
  (*Curl_cfree)((data->state).up.user);
  (data->state).up.user = (char *)0x0;
  (*Curl_cfree)((data->state).up.password);
  (data->state).up.password = (char *)0x0;
  (*Curl_cfree)((data->state).up.options);
  (data->state).up.options = (char *)0x0;
  (*Curl_cfree)((data->state).up.path);
  (data->state).up.path = (char *)0x0;
  (*Curl_cfree)((data->state).up.query);
  (data->state).up.query = (char *)0x0;
  curl_url_cleanup((data->state).uh);
  (data->state).uh = (CURLU *)0x0;
  return;
}

Assistant:

static void up_free(struct Curl_easy *data)
{
  struct urlpieces *up = &data->state.up;
  Curl_safefree(up->scheme);
  Curl_safefree(up->hostname);
  Curl_safefree(up->port);
  Curl_safefree(up->user);
  Curl_safefree(up->password);
  Curl_safefree(up->options);
  Curl_safefree(up->path);
  Curl_safefree(up->query);
  curl_url_cleanup(data->state.uh);
  data->state.uh = NULL;
}